

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

void __thiscall DCanvas::Dim(DCanvas *this,PalEntry color)

{
  uint uVar1;
  uint uVar2;
  DWORD *pDVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float a;
  float dim [4];
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  
  fVar6 = dimamount.Value;
  if (dimamount.Value < 0.0) {
    fVar6 = gameinfo.dimamount;
  }
  pDVar3 = (DWORD *)&dimcolor.super_FIntCVar.Value;
  if (dimamount.Value < 0.0) {
    pDVar3 = &gameinfo.dimcolor;
  }
  uVar1 = *pDVar3;
  uVar4 = uVar1 >> 0x10;
  uVar2 = uVar1 >> 8;
  a = fVar6;
  if ((gameinfo.gametype == GAME_Hexen) && (gamestate == GS_DEMOSCREEN)) {
    a = 1.0;
    if (fVar6 + fVar6 <= 1.0) {
      a = fVar6 + fVar6;
    }
  }
  if ((uint)color.field_0 < 0x1000000) {
    uVar5 = uVar1 & 0xff000000;
  }
  else {
    local_28 = (float)((uint)color.field_0 >> 0x10 & 0xff) / 255.0;
    local_24 = (float)((uint)color.field_0 >> 8 & 0xff) / 255.0;
    local_20 = (float)((uint)color.field_0 & 0xff) / 255.0;
    local_1c = (float)((uint)color.field_0 >> 0x18) / 255.0;
    V_AddBlend((float)(uVar4 & 0xff) / 255.0,(float)(uVar2 & 0xff) / 255.0,
               (float)(uVar1 & 0xff) / 255.0,a,&local_28);
    uVar4 = (uint)(local_28 * 255.0);
    uVar2 = (uint)(local_24 * 255.0);
    uVar1 = (uint)(local_20 * 255.0);
    uVar5 = 0;
    a = local_1c;
  }
  (*(this->super_DObject)._vptr_DObject[0xe])
            (a,this,(ulong)(uVar1 & 0xff | (uVar2 & 0xff) << 8 | (uVar4 & 0xff) << 0x10 | uVar5),0,0
             ,(ulong)(uint)this->Width,(ulong)(uint)this->Height);
  return;
}

Assistant:

void DCanvas::Dim (PalEntry color)
{
	PalEntry dimmer;
	float amount;

	if (dimamount >= 0)
	{
		dimmer = PalEntry(dimcolor);
		amount = dimamount;
	}
	else
	{
		dimmer = gameinfo.dimcolor;
		amount = gameinfo.dimamount;
	}

	if (gameinfo.gametype == GAME_Hexen && gamestate == GS_DEMOSCREEN)
	{ // On the Hexen title screen, the default dimming is not
		// enough to make the menus readable.
		amount = MIN<float> (1.f, amount*2.f);
	}
	// Add the cvar's dimming on top of the color passed to the function
	if (color.a != 0)
	{
		float dim[4] = { color.r/255.f, color.g/255.f, color.b/255.f, color.a/255.f };
		V_AddBlend (dimmer.r/255.f, dimmer.g/255.f, dimmer.b/255.f, amount, dim);
		dimmer = PalEntry (BYTE(dim[0]*255), BYTE(dim[1]*255), BYTE(dim[2]*255));
		amount = dim[3];
	}
	Dim (dimmer, amount, 0, 0, Width, Height);
}